

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::detail::MultiLaneAtomic<int>::store
          (MultiLaneAtomic<int> *this,int desired,memory_order order)

{
  memory_order in_EDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  CacheLineAlignedAtomic *c;
  CacheLineAlignedAtomic *__end0;
  CacheLineAlignedAtomic *__begin0;
  CacheLineAlignedAtomic (*__range3) [32];
  memory_order __b;
  undefined4 *local_38;
  undefined4 local_24;
  
  local_24 = in_ESI;
  for (local_38 = in_RDI; local_38 != in_RDI + 0x200; local_38 = local_38 + 0x10) {
    std::operator&(in_EDX,__memory_order_mask);
    if (in_EDX == memory_order_release) {
      *local_38 = local_24;
    }
    else if (in_EDX == memory_order_seq_cst) {
      LOCK();
      *local_38 = local_24;
      UNLOCK();
    }
    else {
      *local_38 = local_24;
    }
    local_24 = 0;
  }
  return;
}

Assistant:

void store(T desired, std::memory_order order = std::memory_order_seq_cst) DOCTEST_NOEXCEPT {
            // first value becomes desired", all others become 0.
            for(auto& c : m_atomics) {
                c.atomic.store(desired, order);
                desired = {};
            }
        }